

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

bool __thiscall asmjit::String::eq(String *this,char *other,size_t size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  char *__s1;
  bool bVar4;
  
  uVar2 = (ulong)(this->field_0)._type;
  if (uVar2 < 0x1f) {
    __s1 = (char *)((long)&this->field_0 + 1);
  }
  else {
    uVar2 = (this->field_0)._large.size;
    __s1 = (this->field_0)._large.data;
  }
  if (size == 0xffffffffffffffff) {
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        if (__s1[uVar3] != other[uVar3]) {
          return false;
        }
        if (other[uVar3] == '\0') {
          return false;
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    bVar4 = other[uVar2] == '\0';
  }
  else if (uVar2 == size) {
    iVar1 = bcmp(__s1,other,size);
    bVar4 = iVar1 == 0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool isLarge() const noexcept { return _type >= kTypeLarge; }